

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O1

iterator __thiscall
eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::insert
          (vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *this,iterator pos,
          value_type *val)

{
  value_type *pvVar1;
  iterator ppVar2;
  pair<eastl::pair<char,_int>_*,_bool> pVar3;
  
  ppVar2 = (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpBegin;
  if (((ppVar2 == pos) || (pos[-1].first < val->first)) &&
     ((pvVar1 = (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd,
      pvVar1 == pos || (val->first < pos->first)))) {
    if ((pvVar1 == pos) &&
       (pvVar1 != (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.
                  mpCapacity)) {
      (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd = pvVar1 + 1;
      *pvVar1 = *val;
    }
    else {
      vector<eastl::pair<char,_int>,_eastl::allocator>::DoInsertValue(&this->m_base,pos,val);
    }
    ppVar2 = (iterator)
             ((long)pos +
             ((long)(this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.
                    mpBegin - (long)ppVar2));
  }
  else {
    pVar3 = insert(this,val);
    ppVar2 = pVar3.first;
  }
  return ppVar2;
}

Assistant:

iterator insert(iterator const pos, value_type const& val) {
    return
        ((pos == begin() || m_cmp(*(pos-1), val)) &&
         (pos ==   end() || m_cmp(val, *pos)))
        ? m_base.insert(pos, val)
        : insert(val).first
        ;
  }